

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

bool Potassco::detail::find_kv(EnumClass *e,StringSpan *sKey,int *iKey,StringSpan *sOut,int *iOut)

{
  char *pcVar1;
  byte in_AL;
  bool bVar2;
  int iVar3;
  size_t __n;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_40;
  longlong local_38;
  
  iVar4 = e->min;
  pcVar6 = e->rep;
  do {
    __n = strcspn(pcVar6," ,=");
    for (pcVar5 = pcVar6 + __n; *pcVar5 == ' '; pcVar5 = pcVar5 + 1) {
    }
    if (*pcVar5 == '=') {
      local_40 = pcVar5 + 1;
      bVar2 = parseSigned(&local_40,&local_38,-0x80000000,0x7fffffff);
      pcVar5 = local_40 + -1;
      do {
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar1 == ' ');
      if (bVar2) {
        iVar4 = (int)local_38;
      }
    }
    if ((iKey == (int *)0x0) || (iVar4 != *iKey)) {
      if ((sKey != (StringSpan *)0x0) && (sKey->size == __n)) {
        iVar3 = strncmp(pcVar6,sKey->first,__n);
        if (iVar3 == 0) goto LAB_0011c412;
      }
      if (*pcVar5 != ',') {
        in_AL = 0;
        pcVar5 = pcVar5 + 1;
        goto LAB_0011c43d;
      }
      do {
        pcVar6 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar6 == ' ');
      bVar2 = true;
    }
    else {
LAB_0011c412:
      if (iOut != (int *)0x0) {
        *iOut = iVar4;
      }
      in_AL = 1;
      pcVar5 = pcVar6;
      if (sOut != (StringSpan *)0x0) {
        sOut->first = pcVar6;
        sOut->size = __n;
      }
LAB_0011c43d:
      bVar2 = false;
    }
    iVar4 = iVar4 + 1;
    pcVar6 = pcVar5;
    if (!bVar2) {
      return (bool)(in_AL & 1);
    }
  } while( true );
}

Assistant:

bool find_kv(const EnumClass& e, const StringSpan* sKey, const int* iKey, StringSpan* sOut, int* iOut) {
#define SKIPWS(x) while (*(x) == ' ')  ++(x)
	const char* args = e.rep;
	for (int cVal = e.min;; ++cVal) {
		std::size_t s = std::strcspn(args, " ,=");
		const char* v = args + s;
		SKIPWS(v);
		if (*v == '=') { xconvert(v+1, cVal, &v, ','); SKIPWS(v); }
		if ((iKey && cVal == *iKey) || (sKey && sKey->size == s && std::strncmp(args, sKey->first, s) == 0)) {
			if (iOut) { *iOut = cVal; }
			if (sOut) { *sOut = toSpan(args, s); }
			return true;
		}
		if (*(args = v)++ != ',') {
			return false;
		}
		SKIPWS(args);
	}
#undef SKIPWS
}